

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# div.c
# Opt level: O3

float64 ent_d(float32 *p,uint32 n)

{
  float fVar1;
  ulong uVar2;
  double __x;
  double dVar3;
  double dVar4;
  float64 fVar5;
  
  if (n == 0) {
    fVar5 = 0.0;
  }
  else {
    dVar4 = 0.0;
    uVar2 = 0;
    do {
      fVar1 = (float)p[uVar2];
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        __assert_fail("p[k] != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/div.c"
                      ,0x55,"float64 ent_d(float32 *, uint32)");
      }
      __x = (double)fVar1;
      if (1e-08 < __x) {
        dVar3 = log(__x);
        dVar4 = dVar4 - dVar3 * __x;
      }
      uVar2 = uVar2 + 1;
    } while (n != uVar2);
    fVar5 = (float64)(dVar4 * 1.442695041);
  }
  return fVar5;
}

Assistant:

float64
ent_d(float32 *p, uint32 n)
{
    uint32 k;
    float64 y;

    for (k = 0, y = 0; k < n; k++) {
	assert(p[k] != 0);
	
	if (p[k] > 1e-8)
	    y -= p[k] * log(p[k]);
    }

    return y * ln2lg2;
}